

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O2

EffectiveSign __thiscall
slang::ast::IntegerLiteral::getEffectiveSignImpl(IntegerLiteral *this,bool isForConversion)

{
  bitwidth_t bVar1;
  EffectiveSign EVar2;
  undefined7 in_register_00000031;
  SVInt SStack_18;
  
  SVInt::SVInt(&SStack_18,&this->valueStorage);
  if ((int)CONCAT71(in_register_00000031,isForConversion) == 0) {
    EVar2 = Either;
    if (SStack_18.super_SVIntStorage.unknownFlag != false) goto LAB_0045d416;
    bVar1 = SVInt::getActiveBits(&SStack_18);
    if (bVar1 != SStack_18.super_SVIntStorage.bitWidth) goto LAB_0045d416;
  }
  EVar2 = (EffectiveSign)SStack_18.super_SVIntStorage.signFlag;
LAB_0045d416:
  SVInt::~SVInt(&SStack_18);
  return EVar2;
}

Assistant:

Expression::EffectiveSign IntegerLiteral::getEffectiveSignImpl(bool isForConversion) const {
    // We will say that this literal could have been signed if doing
    // so would not change its logical value (i.e. it either already
    // was marked signed, or it's a positive value that would remain
    // positive given a cast to a signed type).
    //
    // We will not warn if the value contains unknowns -- the rationale
    // is that signed-related warnings make no sense in those cases, though
    // we should probably warn separately about the unknowns themselves.
    auto&& val = getValue();
    if (isForConversion || (!val.hasUnknown() && val.getActiveBits() == val.getBitWidth())) {
        return val.isSigned() ? EffectiveSign::Signed : EffectiveSign::Unsigned;
    }

    return EffectiveSign::Either;
}